

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void gc_traverse_proto(global_State *g,GCproto *pt)

{
  byte *pbVar1;
  GCobj *o;
  uint64_t uVar2;
  long lVar3;
  
  pbVar1 = (byte *)((pt->chunkname).gcptr64 + 8);
  *pbVar1 = *pbVar1 & 0xfc;
  if ((ulong)pt->sizekgc != 0) {
    lVar3 = -(ulong)pt->sizekgc;
    do {
      o = *(GCobj **)((pt->k).ptr64 + lVar3 * 8);
      if (((o->gch).marked & 3) != 0) {
        gc_mark(g,o);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
  }
  if ((ulong)pt->trace != 0) {
    uVar2 = *(uint64_t *)(g[1].ctype_state.ptr64 + (ulong)pt->trace * 8);
    if ((*(byte *)(uVar2 + 8) & 3) != 0) {
      *(byte *)(uVar2 + 8) = *(byte *)(uVar2 + 8) & 0xfc;
      *(uint64_t *)(uVar2 + 0x18) = (g->gc).gray.gcptr64;
      (g->gc).gray.gcptr64 = uVar2;
    }
  }
  return;
}

Assistant:

static void gc_traverse_proto(global_State *g, GCproto *pt)
{
  ptrdiff_t i;
  gc_mark_str(proto_chunkname(pt));
  for (i = -(ptrdiff_t)pt->sizekgc; i < 0; i++)  /* Mark collectable consts. */
    gc_markobj(g, proto_kgc(pt, i));
#if LJ_HASJIT
  if (pt->trace) gc_marktrace(g, pt->trace);
#endif
}